

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O3

TRef fold_abc_fwd(jit_State *J)

{
  ushort uVar1;
  IRIns *pIVar2;
  ushort uVar3;
  ushort uVar4;
  long lVar5;
  ushort uVar6;
  ulong uVar7;
  long lVar8;
  
  if (((J->flags & 0x800000) != 0) &&
     (lVar5 = (long)(short)(J->fold).right[0].field_0.op2, -1 < lVar5)) {
    pIVar2 = (J->cur).ir;
    uVar7 = (ulong)(J->fold).right[0].field_0.op1;
    if ((*(char *)((long)pIVar2 + uVar7 * 8 + 5) == ')') &&
       ((lVar8 = (long)*(short *)((long)pIVar2 + uVar7 * 8 + 2), -1 < lVar8 &&
        (pIVar2[lVar5].field_1.op12 + pIVar2[lVar8].field_1.op12 == 0)))) {
      uVar6 = (ushort)(J->fold).ins.field_1.op12;
      uVar4 = (ushort)pIVar2[uVar7].field_1.op12;
      uVar3 = uVar4;
      if (uVar4 < uVar6) {
        uVar3 = uVar6;
      }
      uVar1 = J->chain[10];
      while (uVar3 < uVar1) {
        uVar7 = (ulong)uVar1;
        if ((pIVar2[uVar7].field_0.op1 == uVar6) &&
           (*(ushort *)((long)pIVar2 + uVar7 * 8 + 2) == uVar4)) {
          return 4;
        }
        uVar1 = *(ushort *)((long)pIVar2 + uVar7 * 8 + 6);
      }
    }
  }
  return 0;
}

Assistant:

LJFOLD(ABC any ADD)
LJFOLDF(abc_fwd)
{
  if (LJ_LIKELY(J->flags & JIT_F_OPT_ABC)) {
    if (irref_isk(fright->op2)) {
      IRIns *add2 = IR(fright->op1);
      if (add2->o == IR_ADD && irref_isk(add2->op2) &&
	  IR(fright->op2)->i == -IR(add2->op2)->i) {
	IRRef ref = J->chain[IR_ABC];
	IRRef lim = add2->op1;
	if (fins->op1 > lim) lim = fins->op1;
	while (ref > lim) {
	  IRIns *ir = IR(ref);
	  if (ir->op1 == fins->op1 && ir->op2 == add2->op1)
	    return DROPFOLD;
	  ref = ir->prev;
	}
      }
    }
  }
  return NEXTFOLD;
}